

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_UpcastCopyFrom_Test::
GeneratedMessageTest_UpcastCopyFrom_Test(GeneratedMessageTest_UpcastCopyFrom_Test *this)

{
  GeneratedMessageTest_UpcastCopyFrom_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageTest_UpcastCopyFrom_Test_02a04068;
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, UpcastCopyFrom) {
  // Test the CopyFrom method that takes in the generic const Message&
  // parameter.
  UNITTEST::TestAllTypes message1, message2;

  TestUtil::SetAllFields(&message1);

  const Message* source = absl::implicit_cast<const Message*>(&message1);
  message2.CopyFrom(*source);

  TestUtil::ExpectAllFieldsSet(message2);
}